

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O2

void __thiscall
libchess::Position::generate_quiet_moves(Position *this,MoveList *move_list,Color stm)

{
  generate_pawn_quiets(this,move_list,stm);
  generate_non_pawn_quiets(this,(PieceType)0x1,move_list,stm);
  generate_non_pawn_quiets(this,(PieceType)0x2,move_list,stm);
  generate_non_pawn_quiets(this,(PieceType)0x3,move_list,stm);
  generate_non_pawn_quiets(this,(PieceType)0x4,move_list,stm);
  generate_non_pawn_quiets(this,(PieceType)0x5,move_list,stm);
  generate_castling(this,move_list,stm);
  return;
}

Assistant:

inline void Position::generate_quiet_moves(MoveList& move_list, Color stm) const {
    generate_pawn_quiets(move_list, stm);
    generate_non_pawn_quiets(constants::KNIGHT, move_list, stm);
    generate_non_pawn_quiets(constants::BISHOP, move_list, stm);
    generate_non_pawn_quiets(constants::ROOK, move_list, stm);
    generate_non_pawn_quiets(constants::QUEEN, move_list, stm);
    generate_non_pawn_quiets(constants::KING, move_list, stm);
    generate_castling(move_list, stm);
}